

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.h
# Opt level: O0

uint32_t __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetPointerTypeId
          (MemoryObject *this,CopyPropagateArrays *pass)

{
  TypeManager *this_00;
  DefUseManager *this_01;
  uint32_t uVar1;
  StorageClass storage_class;
  Instruction *pIVar2;
  IRContext *pIVar3;
  undefined1 local_50 [4];
  uint32_t member_pointer_type_id;
  uint32_t local_34;
  Instruction *pIStack_30;
  uint32_t member_type_id;
  Instruction *var_pointer_inst;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  CopyPropagateArrays *pass_local;
  MemoryObject *this_local;
  
  def_use_mgr = (DefUseManager *)pass;
  pass_local = (CopyPropagateArrays *)this;
  pIVar2 = GetVariable(this);
  pIVar3 = opt::Instruction::context(pIVar2);
  type_mgr = (TypeManager *)IRContext::get_def_use_mgr(pIVar3);
  pIVar2 = GetVariable(this);
  pIVar3 = opt::Instruction::context(pIVar2);
  var_pointer_inst = (Instruction *)IRContext::get_type_mgr(pIVar3);
  this_00 = type_mgr;
  pIVar2 = GetVariable(this);
  uVar1 = opt::Instruction::type_id(pIVar2);
  pIStack_30 = analysis::DefUseManager::GetDef((DefUseManager *)this_00,uVar1);
  this_01 = def_use_mgr;
  uVar1 = opt::Instruction::GetSingleWordInOperand(pIStack_30,1);
  GetAccessIds((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,this);
  uVar1 = GetMemberTypeId((CopyPropagateArrays *)this_01,uVar1,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  pIVar2 = var_pointer_inst;
  local_34 = uVar1;
  storage_class = opt::Instruction::GetSingleWordInOperand(pIStack_30,0);
  uVar1 = analysis::TypeManager::FindPointerToType((TypeManager *)pIVar2,uVar1,storage_class);
  return uVar1;
}

Assistant:

uint32_t GetPointerTypeId(const CopyPropagateArrays* pass) const {
      analysis::DefUseManager* def_use_mgr =
          GetVariable()->context()->get_def_use_mgr();
      analysis::TypeManager* type_mgr =
          GetVariable()->context()->get_type_mgr();

      Instruction* var_pointer_inst =
          def_use_mgr->GetDef(GetVariable()->type_id());

      uint32_t member_type_id = pass->GetMemberTypeId(
          var_pointer_inst->GetSingleWordInOperand(1), GetAccessIds());

      uint32_t member_pointer_type_id = type_mgr->FindPointerToType(
          member_type_id, static_cast<spv::StorageClass>(
                              var_pointer_inst->GetSingleWordInOperand(0)));
      return member_pointer_type_id;
    }